

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist_tests.cpp
# Opt level: O2

void __thiscall
skiplist_tests::findearliestatleast_edge_test::test_method(findearliestatleast_edge_test *this)

{
  undefined4 uVar1;
  long lVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  int iVar5;
  CBlockIndex *pCVar6;
  iterator in_R8;
  iterator pvVar7;
  iterator in_R9;
  int *piVar8;
  iterator pvVar9;
  _List_node_base *p_Var10;
  iterator __tmp;
  long lVar11;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  assertion_result *ar;
  assertion_result *paVar12;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  undefined1 *local_460;
  undefined1 *local_458;
  char *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 *local_400;
  undefined1 *local_3f8;
  char *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  char *local_390;
  char *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  undefined1 *local_340;
  undefined1 *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  undefined1 *local_2e0;
  undefined1 *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  undefined1 *local_250;
  undefined1 *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  assertion_result local_1e0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  lazy_ostream local_a8;
  undefined1 *local_98;
  char **local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  char *local_78;
  char *local_70;
  CChain chain;
  list<CBlockIndex,_std::allocator<CBlockIndex>_> blocks;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node._M_size = 0;
  blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&blocks;
  blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&blocks;
  for (lVar11 = 0;
      p_Var4 = blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
               super__List_node_base._M_prev,
      p_Var3 = blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
               super__List_node_base._M_next, lVar11 != 0x24; lVar11 = lVar11 + 4) {
    uVar1 = *(undefined4 *)((long)&DAT_00c50d18 + lVar11);
    p_Var10 = (_List_node_base *)0x0;
    if (blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&blocks) {
      p_Var10 = blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
                super__List_node_base._M_prev + 1;
    }
    std::__cxx11::list<CBlockIndex,_std::allocator<CBlockIndex>_>::emplace_back<>(&blocks);
    if (p_Var3 == (_List_node_base *)&blocks) {
      iVar5 = 0;
    }
    else {
      iVar5 = *(int *)&p_Var4[2]._M_prev + 1;
    }
    *(int *)&blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
             super__List_node_base._M_prev[2]._M_prev = iVar5;
    blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
    super__List_node_base._M_prev[1]._M_prev = p_Var10;
    CBlockIndex::BuildSkip
              ((CBlockIndex *)
               (blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
                super__List_node_base._M_prev + 1));
    *(undefined4 *)
     &blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl._M_node.
      super__List_node_base._M_prev[10]._M_next = uVar1;
  }
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  chain.vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CChain::SetTip(&chain,(CBlockIndex *)
                        (blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>._M_impl.
                         _M_node.super__List_node_base._M_prev + 1));
  local_78 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_70 = "";
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xa1;
  file.m_begin = (iterator)&local_78;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_88,msg);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_b0 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0x32,0);
  piVar8 = &pCVar6->nHeight;
  paVar12 = &local_1e0;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_b8,0xa1,1,2,piVar8,"chain.FindEarliestAtLeast(50, 0)->nHeight",paVar12
             ,"0");
  local_c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_c0 = "";
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xa2;
  file_00.m_begin = (iterator)&local_c8;
  msg_00.m_end = (iterator)piVar8;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_d8,msg_00
            );
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_e0 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,100,0);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_e8,0xa2,1,2,piVar8,"chain.FindEarliestAtLeast(100, 0)->nHeight",
             paVar12,"0");
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_f0 = "";
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xa3;
  file_01.m_begin = (iterator)&local_f8;
  msg_01.m_end = (iterator)piVar8;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_108,
             msg_01);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_118 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_110 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0x96,0);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x3;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_118,0xa3,1,2,piVar8,"chain.FindEarliestAtLeast(150, 0)->nHeight",
             paVar12,"3");
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xa4;
  file_02.m_begin = (iterator)&local_128;
  msg_02.m_end = (iterator)piVar8;
  msg_02.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_138,
             msg_02);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_148 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_140 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,200,0);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x3;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_148,0xa4,1,2,piVar8,"chain.FindEarliestAtLeast(200, 0)->nHeight",
             paVar12,"3");
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xa5;
  file_03.m_begin = (iterator)&local_158;
  msg_03.m_end = (iterator)piVar8;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_168,
             msg_03);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_170 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0xfa,0);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x6;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_178,0xa5,1,2,piVar8,"chain.FindEarliestAtLeast(250, 0)->nHeight",
             paVar12,"6");
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0xa6;
  file_04.m_begin = (iterator)&local_188;
  msg_04.m_end = (iterator)piVar8;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_198,
             msg_04);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_1a0 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,300,0);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x6;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_1a8,0xa6,1,2,piVar8,"chain.FindEarliestAtLeast(300, 0)->nHeight",
             paVar12,"6");
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xa7;
  file_05.m_begin = (iterator)&local_1b8;
  msg_05.m_end = (iterator)piVar8;
  msg_05.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_1c8,
             msg_05);
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0x15e,0);
  ar = &local_1e0;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pCVar6 == (CBlockIndex *)0x0);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "!chain.FindEarliestAtLeast(350, 0)";
  local_1e8 = "";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_1f8 = "";
  pvVar7 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_90 = &local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (ar,&local_a8,1,0,WARN,(check_type)paVar12,(size_t)&local_200,0xa7);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xa9;
  file_06.m_begin = (iterator)&local_210;
  msg_06.m_end = pvVar9;
  msg_06.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_220,
             msg_06);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_228 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0,0);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_230,0xa9,1,2,piVar8,"chain.FindEarliestAtLeast(0, 0)->nHeight",ar,"0")
  ;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_238 = "";
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  local_248 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xaa;
  file_07.m_begin = (iterator)&local_240;
  msg_07.m_end = (iterator)piVar8;
  msg_07.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_250,
             msg_07);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_258 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,-1,0);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_260,0xaa,1,2,piVar8,"chain.FindEarliestAtLeast(-1, 0)->nHeight",ar,"0"
            );
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xac;
  file_08.m_begin = (iterator)&local_270;
  msg_08.m_end = (iterator)piVar8;
  msg_08.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_280,
             msg_08);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_288 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,-0x8000000000000000,0);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_290,0xac,1,2,piVar8,
             "chain.FindEarliestAtLeast(std::numeric_limits<int64_t>::min(), 0)->nHeight",ar,"0");
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xad;
  file_09.m_begin = (iterator)&local_2a0;
  msg_09.m_end = (iterator)piVar8;
  msg_09.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_2b0,
             msg_09);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_2b8 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,-0x100000000,0);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_2c0,0xad,1,2,piVar8,
             "chain.FindEarliestAtLeast(-int64_t(std::numeric_limits<unsigned int>::max()) - 1, 0)->nHeight"
             ,ar,"0");
  local_2d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_2c8 = "";
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xae;
  file_10.m_begin = (iterator)&local_2d0;
  msg_10.m_end = (iterator)piVar8;
  msg_10.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_2e0,
             msg_10);
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0x7fffffffffffffff,0);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "!chain.FindEarliestAtLeast(std::numeric_limits<int64_t>::max(), 0)";
  local_1e8 = "";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_2e8 = "";
  pvVar7 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_90 = &local_1f0;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pCVar6 == (CBlockIndex *)0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_a8,1,0,WARN,(check_type)ar,(size_t)&local_2f0,0xae);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xaf;
  file_11.m_begin = (iterator)&local_300;
  msg_11.m_end = pvVar9;
  msg_11.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_310,
             msg_11);
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0xffffffff,0);
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar6 == (CBlockIndex *)0x0);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "!chain.FindEarliestAtLeast(std::numeric_limits<unsigned int>::max(), 0)";
  local_1e8 = "";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_318 = "";
  pvVar7 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_90 = &local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_a8,1,0,WARN,(check_type)ar,(size_t)&local_320,0xaf);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_330 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_328 = "";
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xb0;
  file_12.m_begin = (iterator)&local_330;
  msg_12.m_end = pvVar9;
  msg_12.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_340,
             msg_12);
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0x100000000,0);
  paVar12 = &local_1e0;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pCVar6 == (CBlockIndex *)0x0);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "!chain.FindEarliestAtLeast(int64_t(std::numeric_limits<unsigned int>::max()) + 1, 0)"
  ;
  local_1e8 = "";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_348 = "";
  pvVar7 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_90 = &local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (paVar12,&local_a8,1,0,WARN,(check_type)ar,(size_t)&local_350,0xb0);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xb2;
  file_13.m_begin = (iterator)&local_360;
  msg_13.m_end = pvVar9;
  msg_13.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_370,
             msg_13);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_378 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0,-1);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_380,0xb2,1,2,piVar8,"chain.FindEarliestAtLeast(0, -1)->nHeight",
             paVar12,"0");
  local_390 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_388 = "";
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xb3;
  file_14.m_begin = (iterator)&local_390;
  msg_14.m_end = (iterator)piVar8;
  msg_14.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_3a0,
             msg_14);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_3a8 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0,0);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x0;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_3b0,0xb3,1,2,piVar8,"chain.FindEarliestAtLeast(0, 0)->nHeight",paVar12
             ,"0");
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xb4;
  file_15.m_begin = (iterator)&local_3c0;
  msg_15.m_end = (iterator)piVar8;
  msg_15.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_3d0,
             msg_15);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_3d8 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0,3);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x3;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_3e0,0xb4,1,2,piVar8,"chain.FindEarliestAtLeast(0, 3)->nHeight",paVar12
             ,"3");
  local_3f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_3e8 = "";
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xb5;
  file_16.m_begin = (iterator)&local_3f0;
  msg_16.m_end = (iterator)piVar8;
  msg_16.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_400,
             msg_16);
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011480b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (char **)0xc7f1cc;
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_408 = "";
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0,8);
  piVar8 = &pCVar6->nHeight;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)0x8;
  local_1e0._1_3_ = 0;
  pvVar7 = (iterator)0x2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_a8,&local_410,0xb5,1,2,piVar8,"chain.FindEarliestAtLeast(0, 8)->nHeight",paVar12
             ,"8");
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xb6;
  file_17.m_begin = (iterator)&local_420;
  msg_17.m_end = (iterator)piVar8;
  msg_17.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_430,
             msg_17);
  pCVar6 = CChain::FindEarliestAtLeast(&chain,0,9);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "!chain.FindEarliestAtLeast(0, 9)";
  local_1e8 = "";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_438 = "";
  pvVar7 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_90 = &local_1f0;
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(pCVar6 == (CBlockIndex *)0x0);
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_a8,1,0,WARN,(check_type)paVar12,(size_t)&local_440,0xb6);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  pCVar6 = CChain::FindEarliestAtLeast(&chain,100,2);
  local_450 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_448 = "";
  local_460 = &boost::unit_test::basic_cstring<char_const>::null;
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0xb9;
  file_18.m_begin = (iterator)&local_450;
  msg_18.m_end = pvVar9;
  msg_18.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_460,
             msg_18);
  if (pCVar6->nTimeMax < 100) {
    local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(pCVar6->nHeight == 2);
  }
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "ret1->nTimeMax >= 100 && ret1->nHeight == 2";
  local_1e8 = "";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_468 = "";
  pvVar7 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_90 = &local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_a8,1,0,WARN,(check_type)paVar12,(size_t)&local_470,0xb9);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xba;
  file_19.m_begin = (iterator)&local_480;
  msg_19.m_end = pvVar9;
  msg_19.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_490,
             msg_19);
  pCVar6 = CChain::FindEarliestAtLeast(&chain,300,9);
  local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(pCVar6 == (CBlockIndex *)0x0);
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "!chain.FindEarliestAtLeast(300, 9)";
  local_1e8 = "";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_498 = "";
  pvVar7 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  local_90 = &local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_a8,1,0,WARN,(check_type)paVar12,(size_t)&local_4a0,0xba);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  pCVar6 = CChain::FindEarliestAtLeast(&chain,200,4);
  local_4b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0xbc;
  file_20.m_begin = (iterator)&local_4b0;
  msg_20.m_end = pvVar9;
  msg_20.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4c0,
             msg_20);
  if (pCVar6->nTimeMax < 200) {
    local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(class_property<bool>)0x0;
  }
  else {
    local_1e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(pCVar6->nHeight == 4);
  }
  local_1e0.m_message.px = (element_type *)0x0;
  local_1e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f0 = "ret2->nTimeMax >= 200 && ret2->nHeight == 4";
  local_1e8 = "";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/skiplist_tests.cpp"
  ;
  local_4c8 = "";
  local_90 = &local_1f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e0,&local_a8,1,0,WARN,(check_type)paVar12,(size_t)&local_4d0,0xbc);
  boost::detail::shared_count::~shared_count(&local_1e0.m_message.pn);
  std::_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>::~_Vector_base
            ((_Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_> *)&chain);
  std::__cxx11::_List_base<CBlockIndex,_std::allocator<CBlockIndex>_>::_M_clear
            (&blocks.super__List_base<CBlockIndex,_std::allocator<CBlockIndex>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(findearliestatleast_edge_test)
{
    std::list<CBlockIndex> blocks;
    for (const unsigned int timeMax : {100, 100, 100, 200, 200, 200, 300, 300, 300}) {
        CBlockIndex* prev = blocks.empty() ? nullptr : &blocks.back();
        blocks.emplace_back();
        blocks.back().nHeight = prev ? prev->nHeight + 1 : 0;
        blocks.back().pprev = prev;
        blocks.back().BuildSkip();
        blocks.back().nTimeMax = timeMax;
    }

    CChain chain;
    chain.SetTip(blocks.back());

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(50, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(100, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(150, 0)->nHeight, 3);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(200, 0)->nHeight, 3);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(250, 0)->nHeight, 6);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(300, 0)->nHeight, 6);
    BOOST_CHECK(!chain.FindEarliestAtLeast(350, 0));

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(-1, 0)->nHeight, 0);

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(std::numeric_limits<int64_t>::min(), 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(-int64_t(std::numeric_limits<unsigned int>::max()) - 1, 0)->nHeight, 0);
    BOOST_CHECK(!chain.FindEarliestAtLeast(std::numeric_limits<int64_t>::max(), 0));
    BOOST_CHECK(!chain.FindEarliestAtLeast(std::numeric_limits<unsigned int>::max(), 0));
    BOOST_CHECK(!chain.FindEarliestAtLeast(int64_t(std::numeric_limits<unsigned int>::max()) + 1, 0));

    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, -1)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 0)->nHeight, 0);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 3)->nHeight, 3);
    BOOST_CHECK_EQUAL(chain.FindEarliestAtLeast(0, 8)->nHeight, 8);
    BOOST_CHECK(!chain.FindEarliestAtLeast(0, 9));

    CBlockIndex* ret1 = chain.FindEarliestAtLeast(100, 2);
    BOOST_CHECK(ret1->nTimeMax >= 100 && ret1->nHeight == 2);
    BOOST_CHECK(!chain.FindEarliestAtLeast(300, 9));
    CBlockIndex* ret2 = chain.FindEarliestAtLeast(200, 4);
    BOOST_CHECK(ret2->nTimeMax >= 200 && ret2->nHeight == 4);
}